

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

int32_t __thiscall icu_63::RBBISetBuilder::getTrieSize(RBBISetBuilder *this)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    utrie2_freeze_63(this->fTrie,UTRIE2_16_VALUE_BITS,this->fStatus);
    uVar1 = utrie2_serialize_63(this->fTrie,(void *)0x0,0,this->fStatus);
    this->fTrieSize = uVar1;
    if (*this->fStatus == U_BUFFER_OVERFLOW_ERROR) {
      *this->fStatus = U_ZERO_ERROR;
    }
  }
  return uVar1;
}

Assistant:

int32_t RBBISetBuilder::getTrieSize()  {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    utrie2_freeze(fTrie, UTRIE2_16_VALUE_BITS, fStatus);
    fTrieSize  = utrie2_serialize(fTrie,
                                  NULL,                // Buffer
                                  0,                   // Capacity
                                  fStatus);
    if (*fStatus == U_BUFFER_OVERFLOW_ERROR) {
        *fStatus = U_ZERO_ERROR;
    }
    // RBBIDebugPrintf("Trie table size is %d\n", trieSize);
    return fTrieSize;
}